

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O1

int Pla_ManHashDistance1(Pla_Man_t *p)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  Tab_Man_t *pTab;
  Tab_Obj_t *pTVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Tab_Obj_t *pTVar16;
  
  iVar2 = p->nIns;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar10 = iVar2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar10;
  if (iVar10 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar10 << 2);
  }
  p_00->pArray = piVar8;
  uVar14 = (p->vCubes).nSize;
  if (1 < uVar14) {
    uVar14 = uVar14 - 1;
    if (uVar14 == 0) {
      uVar14 = 0;
    }
    else {
      uVar7 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar14 = (uVar7 ^ 0xffffffe0) + 0x21;
    }
  }
  if (0x18 < uVar14) {
    __assert_fail("nBits <= 26",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                  ,0xb9,"int Pla_ManHashDistance1(Pla_Man_t *)");
  }
  pTab = (Tab_Man_t *)calloc(1,0x18);
  if (uVar14 < 2) {
    __assert_fail("LogSize >= 4 && LogSize <= 26",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                  ,0x6e,"Tab_Man_t *Tab_ManAlloc(int, Pla_Man_t *)");
  }
  uVar14 = 4 << ((byte)uVar14 & 0x1f);
  pTab->SizeMask = uVar14 - 1;
  pTVar9 = (Tab_Obj_t *)calloc((ulong)uVar14,0x10);
  pTab->pBins = pTVar9;
  pTab->nBins = 1;
  pTab->pMan = p;
  Pla_ManConvertFromBits(p);
  Pla_ManHashCubes(p,pTab);
  if ((p->vCubeLits).nSize < 1) {
    uVar14 = 0;
  }
  else {
    lVar11 = 0;
    uVar14 = 0;
    do {
      pVVar6 = (p->vCubeLits).pArray;
      p_00->nSize = 0;
      if (0 < pVVar6[lVar11].nSize) {
        lVar12 = 0;
        do {
          Vec_IntPush(p_00,pVVar6[lVar11].pArray[lVar12]);
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar6[lVar11].nSize);
      }
      if ((p->vHashes).nSize <= lVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = p_00->nSize;
      if (0 < (long)(int)uVar7) {
        iVar2 = (p->vHashes).pArray[lVar11];
        piVar8 = p_00->pArray;
        lVar12 = 0;
        do {
          uVar3 = piVar8[lVar12];
          if ((int)uVar3 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10e,"int Abc_LitNot(int)");
          }
          if (0xff < uVar3) {
            __assert_fail("i >= 0 && i < PLA_HASH_VALUE_NUM",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                          ,0x42,"int Pla_HashValue(int)");
          }
          uVar15 = (ulong)uVar3 ^ 1;
          uVar4 = s_PlaHashValues[uVar15];
          uVar5 = s_PlaHashValues[uVar3];
          piVar8[lVar12] = (int)uVar15;
          pTVar9 = pTab->pBins;
          iVar10 = 0;
          if ((pTVar9 != (Tab_Obj_t *)0x0) &&
             (pTVar9[(int)(((uVar4 & 0x3ffffff) + iVar2) - (uVar5 & 0x3ffffff) & pTab->SizeMask)].
              Table != 0)) {
            pTVar16 = pTVar9 + pTVar9[(int)(((uVar4 & 0x3ffffff) + iVar2) - (uVar5 & 0x3ffffff) &
                                           pTab->SizeMask)].Table;
            do {
              lVar13 = (long)pTVar16->Cube;
              if ((lVar13 < 0) || ((pTab->pMan->vCubeLits).nSize <= pTVar16->Cube)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                              ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
              }
              pVVar6 = (pTab->pMan->vCubeLits).pArray;
              uVar4 = pVVar6[lVar13].nSize;
              if (uVar4 == uVar7) {
                if ((int)uVar4 < 1) {
LAB_003582ae:
                  iVar10 = 1;
                  break;
                }
                uVar15 = 0;
                while (pVVar6[lVar13].pArray[uVar15] == piVar8[uVar15]) {
                  uVar15 = uVar15 + 1;
                  if (uVar4 == uVar15) goto LAB_003582ae;
                }
              }
              piVar1 = &pTVar16->Next;
              pTVar16 = pTVar9 + *piVar1;
              if ((long)*piVar1 == 0) {
                pTVar16 = (Tab_Obj_t *)0x0;
              }
            } while (pTVar16 != (Tab_Obj_t *)0x0);
          }
          uVar14 = uVar14 + iVar10;
          piVar8[lVar12] = uVar3;
          lVar12 = lVar12 + 1;
        } while (lVar12 != (int)uVar7);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (p->vCubeLits).nSize);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (pTab->pBins != (Tab_Obj_t *)0x0) {
    free(pTab->pBins);
    pTab->pBins = (Tab_Obj_t *)0x0;
  }
  free(pTab);
  if ((uVar14 & 1) != 0) {
    __assert_fail("!(Count & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaHash.c"
                  ,0xd1,"int Pla_ManHashDistance1(Pla_Man_t *)");
  }
  return (int)uVar14 >> 1;
}

Assistant:

int Pla_ManHashDistance1( Pla_Man_t * p )
{
    Tab_Man_t * pTab;
    Vec_Int_t * vCube;
    Vec_Int_t * vCubeCopy = Vec_IntAlloc( p->nIns );
    int nBits = Abc_Base2Log( Pla_ManCubeNum(p) ) + 2;
    int i, k, Lit, Value, ValueCopy, Count = 0;
    assert( nBits <= 26 );
    pTab = Tab_ManAlloc( nBits, p );
    Pla_ManConvertFromBits( p );
    Pla_ManHashCubes( p, pTab );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
    {
        Vec_IntClear( vCubeCopy );
        Vec_IntAppend( vCubeCopy, vCube );
        Value = ValueCopy = Vec_IntEntry( &p->vHashes, i );
        Vec_IntForEachEntry( vCubeCopy, Lit, k )
        {
            // create new
            Value += Pla_HashValue(Abc_LitNot(Lit)) - Pla_HashValue(Lit);
            Vec_IntWriteEntry( vCubeCopy, k, Abc_LitNot(Lit) );
            // check the cube
            Count += Tab_ManHashLookup( pTab, Value, vCubeCopy );
            // create old
            Value -= Pla_HashValue(Abc_LitNot(Lit)) - Pla_HashValue(Lit);
            Vec_IntWriteEntry( vCubeCopy, k, Lit );
        }
        assert( Value == ValueCopy );
    }
    Vec_IntFree( vCubeCopy );
    Tab_ManFree( pTab );
    assert( !(Count & 1) );
    return Count/2;
}